

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nocpout.c
# Opt level: O2

void ldifusreg(void)

{
  Item *pIVar1;
  Item *pIVar2;
  Item *pIVar3;
  char *pcVar4;
  Symbol *pSVar5;
  Symbol *pSVar6;
  Item *pIVar7;
  uint uVar8;
  uint uVar9;
  Item *item;
  Item *item_00;
  
  uVar8 = 0;
  pIVar7 = ldifuslist;
  while (pIVar7->next != ldifuslist) {
    pIVar7 = pIVar7->next->next;
    item_00 = (pIVar7->element).itm;
    pIVar7 = pIVar7->next;
    pIVar1 = (pIVar7->element).itm;
    pIVar7 = pIVar7->next;
    item = (pIVar7->element).itm;
    pIVar7 = pIVar7->next;
    pIVar2 = (pIVar7->element).itm;
    pIVar7 = pIVar7->next;
    pIVar3 = (pIVar7->element).itm;
    pIVar7 = pIVar7->next;
    pcVar4 = (pIVar7->element).str;
    uVar8 = uVar8 + 1;
    sprintf(buf,
            "static void* _difspace%d;\nextern double nrn_nernst_coef();\nstatic double _difcoef%d(int _i, double* _p, Datum* _ppvar, double* _pdvol, double* _pdfcdc, ThreadDatum* _thread, NrnThread* _nt) {\n   *_pdvol = "
            ,(ulong)uVar8,(ulong)uVar8);
    lappendstr(procfunc,buf);
    for (; item != pIVar2; item = item->next) {
      lappenditem(procfunc,item);
    }
    if (*pcVar4 == '\0') {
      builtin_strncpy(buf,"; *_pdfcdc=0.;\n",0x10);
    }
    else {
      sprintf(buf,";\n if (_i == %s) {\n  *_pdfcdc = %s;\n }else{ *_pdfcdc=0.;}\n",pIVar3);
    }
    lappendstr(procfunc,buf);
    lappendstr(procfunc,"  return");
    for (; item_00 != pIVar1; item_00 = item_00->next) {
      lappenditem(procfunc,item_00);
    }
    lappendstr(procfunc,";\n}\n");
  }
  lappendstr(procfunc,"static void _difusfunc(_f, _nt) void(*_f)(); NrnThread* _nt; {int _i;\n");
  uVar8 = 1;
  pIVar7 = ldifuslist;
  while( true ) {
    pIVar7 = pIVar7->next;
    if (pIVar7 == ldifuslist) {
      lappendstr(procfunc,"}\n");
      return;
    }
    pSVar5 = (pIVar7->element).sym;
    pIVar7 = pIVar7->next->next->next->next->next->next;
    if ((pSVar5->subtype & 0x20) == 0) {
      sprintf(buf," (*_f)(_mechtype, _difcoef%d, &_difspace%d, 0, ",(ulong)uVar8,(ulong)uVar8);
    }
    else {
      sprintf(buf," for (_i=0; _i < %d; ++_i) (*_f)(_mechtype, _difcoef%d, &_difspace%d, _i, ",
              (ulong)(uint)pSVar5->araydim,(ulong)uVar8,(ulong)uVar8);
    }
    lappendstr(procfunc,buf);
    sprintf(buf,"D%s",pSVar5->name);
    pSVar6 = lookup(buf);
    if (pSVar6 == (Symbol *)0x0) break;
    if ((pSVar5->nrntype & 0x1000) == 0) {
      uVar9 = pSVar5->varnum;
    }
    else {
      uVar9 = ~pSVar5->ioncount_;
    }
    sprintf(buf,"%d, %d",(ulong)uVar9,(ulong)(uint)pSVar6->varnum);
    lappendstr(procfunc,buf);
    lappendstr(procfunc,", _nt);\n");
    uVar8 = uVar8 + 1;
  }
  __assert_fail("d",
                "/workspace/llm4binary/github/license_all_cmakelists_25/BlueBrain[P]mod2c/src/mod2c_core/nocpout.c"
                ,0x6cd,"void ldifusreg()");
}

Assistant:

void ldifusreg() {
	Item* q, *qdexp, *qb1, *qvexp, *qb2, *q1;
	char* cfindex, *dfdcur;
	Symbol* s, *d;
	int n;
	
	/* ldifuslist format: series of symbol qdexp qb1 svexp qb2
			indexforflux dflux/dconc */
	n = 0;
	ITERATE(q, ldifuslist) {
		s = SYM(q); q = q->next;
		qdexp = ITM(q); q = q->next;
		qb1 = ITM(q); q = q->next;
		qvexp = ITM(q); q = q->next;
		qb2 = ITM(q); q = q->next;
		cfindex = STR(q); q = q->next;
		dfdcur = STR(q);
		++n;
sprintf(buf, "static void* _difspace%d;\nextern double nrn_nernst_coef();\n\
static double _difcoef%d(int _i, double* _p, Datum* _ppvar, double* _pdvol, double* _pdfcdc, ThreadDatum* _thread, NrnThread* _nt) {\n  \
 *_pdvol = ", n, n);
		lappendstr(procfunc, buf);
		for (q1 = qvexp; q1 != qb2; q1 = q1->next) {
			lappenditem(procfunc, q1);
		}
		if (dfdcur[0]) {
			sprintf(buf, ";\n\
 if (_i == %s) {\n  *_pdfcdc = %s;\n }else{ *_pdfcdc=0.;}\n", cfindex, dfdcur);
 		}else{
 			sprintf(buf, "; *_pdfcdc=0.;\n");
 		}
		lappendstr(procfunc, buf);
		lappendstr(procfunc, "  return");
		for (q1 = qdexp; q1 != qb1; q1 = q1->next) {
			lappenditem(procfunc, q1);
		}
		lappendstr(procfunc, ";\n}\n");
	}
#if MAC
	lappendstr(procfunc, "static void _difusfunc(_f, _nt) void *_f; NrnThread* _nt; {int _i;\n");
#else
	lappendstr(procfunc, "static void _difusfunc(_f, _nt) void(*_f)(); NrnThread* _nt; {int _i;\n");
#endif
	n = 0;
	ITERATE(q, ldifuslist) {
		s = SYM(q); q = q->next;
		qdexp = ITM(q); q = q->next;
		qb1 = ITM(q); q = q->next;
		qvexp = ITM(q); q = q->next;
		qb2 = ITM(q); q = q->next;
		cfindex = STR(q); q = q->next;
		dfdcur = STR(q);
		++n;

		if (s->subtype & ARRAY) {
#if MAC
sprintf(buf, " for (_i=0; _i < %d; ++_i) mac_difusfunc(_f, _mechtype, _difcoef%d, &_difspace%d, _i, ", s->araydim, n, n);
#else
sprintf(buf, " for (_i=0; _i < %d; ++_i) (*_f)(_mechtype, _difcoef%d, &_difspace%d, _i, ", s->araydim, n, n);
#endif
		}else{
#if MAC
sprintf(buf, " mac_difusfunc(_f,_mechtype, _difcoef%d, &_difspace%d, 0, ", n, n);
#else
sprintf(buf, " (*_f)(_mechtype, _difcoef%d, &_difspace%d, 0, ", n, n);
#endif
		}
		lappendstr(procfunc, buf);

		sprintf(buf, "D%s", s->name);
		d = lookup(buf);
		assert(d);
		if (s->nrntype & IONCONC) {
			sprintf(buf, "%d, %d",
			  - (s->ioncount_ + 1), d->varnum);
		}else{
			sprintf(buf, "%d, %d", s->varnum, d->varnum);
		}
		lappendstr(procfunc, buf);
		lappendstr(procfunc, ", _nt);\n");
	}
	lappendstr(procfunc, "}\n");
}